

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nassa_e_contro.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  long *plVar1;
  short *psVar2;
  short *psVar3;
  ostream *poVar4;
  _List_node_base *p_Var5;
  int iVar6;
  int local_2b0;
  value_type_conflict local_2aa;
  int local_2a8;
  int x;
  array<short,_3UL> pieno;
  short local_29a;
  array<short,_17UL> cavalli;
  short local_276 [3];
  list<short,_std::allocator<short>_> serie;
  string sFilename;
  ifstream inFile;
  byte abStack_218 [488];
  
  cavalli._M_elems[8] = 0x12;
  cavalli._M_elems[9] = 0x15;
  cavalli._M_elems[10] = 0x16;
  cavalli._M_elems[0xb] = 0x19;
  cavalli._M_elems[0xc] = 0x1c;
  cavalli._M_elems[0xd] = 0x1d;
  cavalli._M_elems[0xe] = 0;
  cavalli._M_elems[0xf] = 0;
  cavalli._M_elems[0] = 0;
  cavalli._M_elems[1] = 3;
  cavalli._M_elems[2] = 0xc;
  cavalli._M_elems[3] = 0xf;
  cavalli._M_elems[4] = 0x20;
  cavalli._M_elems[5] = 0x23;
  cavalli._M_elems[6] = 4;
  cavalli._M_elems[7] = 7;
  cavalli._M_elems[0x10] = 0;
  pieno._M_elems[2] = 0x1a;
  pieno._M_elems[0] = 2;
  pieno._M_elems[1] = 0x13;
  serie.super__List_base<short,_std::allocator<short>_>._M_impl._M_node.super__List_node_base.
  _M_next = (_List_node_base *)&serie;
  serie.super__List_base<short,_std::allocator<short>_>._M_impl._M_node._M_size = 0;
  serie.super__List_base<short,_std::allocator<short>_>._M_impl._M_node.super__List_node_base.
  _M_prev = serie.super__List_base<short,_std::allocator<short>_>._M_impl._M_node.
            super__List_node_base._M_next;
  std::ifstream::ifstream(&inFile);
  if (argc == 2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sFilename,argv[1],(allocator<char> *)&x);
    std::ifstream::open((string *)&inFile,(_Ios_Openmode)&sFilename);
    if ((abStack_218[*(long *)(_inFile + -0x18)] & 5) != 0) {
      std::operator<<((ostream *)&std::cerr,"Unable to open file datafile.txt");
      exit(1);
    }
    while( true ) {
      plVar1 = (long *)std::istream::operator>>((istream *)&inFile,&x);
      if ((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) != 0) break;
      local_2aa = (value_type_conflict)x;
      std::__cxx11::list<short,_std::allocator<short>_>::push_back(&serie,&local_2aa);
    }
    std::ifstream::close();
    local_2a8 = 0;
    iVar6 = 0;
    local_2b0 = 0;
    p_Var5 = (_List_node_base *)&serie;
    while (p_Var5 = (((_List_base<short,_std::allocator<short>_> *)&p_Var5->_M_next)->_M_impl).
                    _M_node.super__List_node_base._M_next, p_Var5 != (_List_node_base *)&serie) {
      psVar2 = std::__find_if<short*,__gnu_cxx::__ops::_Iter_equals_val<short_const>>
                         (&cavalli,local_276,p_Var5 + 1);
      psVar3 = std::__find_if<short*,__gnu_cxx::__ops::_Iter_equals_val<short_const>>
                         (&pieno,&local_29a,p_Var5 + 1);
      if (psVar3 == &local_29a) {
        if (psVar2 != local_276) {
          local_2b0 = local_2b0 + 0x46;
          goto LAB_00102459;
        }
        local_2b0 = local_2b0 + -100;
        local_2a8 = local_2a8 + 1;
      }
      else {
        local_2b0 = local_2b0 + 0xfa;
LAB_00102459:
        iVar6 = iVar6 + 1;
      }
    }
    std::operator<<((ostream *)&std::cout,(string *)&sFilename);
    poVar4 = std::operator<<((ostream *)&std::cout," Win:");
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 5;
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar6);
    poVar4 = std::operator<<(poVar4," Loss:");
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 5;
    std::ostream::operator<<(poVar4,local_2a8);
    *(undefined8 *)(__gxx_personality_v0 + *(long *)(std::cout + -0x18)) = 5;
    poVar4 = std::operator<<((ostream *)&std::cout," Balance:");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_2b0);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::~string((string *)&sFilename);
    iVar6 = 0;
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cerr,"example: roulette serie.txt");
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar6 = -1;
  }
  std::ifstream::~ifstream(&inFile);
  std::__cxx11::_List_base<short,_std::allocator<short>_>::_M_clear
            (&serie.super__List_base<short,_std::allocator<short>_>);
  return iVar6;
}

Assistant:

int main(int argc, char *argv[])
{
    // your code goes here
    //nassa = 0/3-12/15-19-26-32/35
    //contro nassa = 2-4/7-18/21-22/25-28/29 

    std::array<short, 17> cavalli{{0,3,12,15,32,35,4,7,18,21,22,25,28,29}};
    std::array<short, 3> pieno{{2,19,26}};
    std::list<short> serie;
    ifstream inFile;
    if (argc!=2)
    {
        std::cerr<<"example: roulette serie.txt"<<std::endl;
        return -1;
    }

    std::string sFilename(argv[1]);
    inFile.open(sFilename);
    if (!inFile)
    {
        std::cerr << "Unable to open file datafile.txt";
        exit(1); // call system to stop
    }
    int x;
    while (inFile >> x)
    {
        //std::cout<<x<<std::endl;
        serie.push_back(x);
    }
    inFile.close();

    int maxperdita;
    int balance=0;
    int win=0;
    int loss=0;
    for (short &estratto : serie)
    {
        
        bool bIsCavallo = std::find(std::begin(cavalli), std::end(cavalli), estratto) != std::end(cavalli);
        bool bIsPieno = std::find(std::begin(pieno), std::end(pieno), estratto) != std::end(pieno);

        if (bIsPieno)
        {
            balance+=250;
            win++;
        }
        else if (bIsCavallo) 
        {
            balance+=70;
            win++;
        }
        else
        { 
            balance-=100;
            loss++;
        }
    }
    std::cout << sFilename;
    std::cout << " Win:" << std::setw(5)<<win<< " Loss:" <<std::setw(5)<< loss;
    std::cout <<std::setw(5)<< " Balance:" << balance << std::endl;
    return 0;
}